

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  _func_int **pp_Var6;
  _func_int *p_Var7;
  long *plVar8;
  Layer *pLVar9;
  undefined8 uVar10;
  undefined8 uVar17;
  undefined8 uVar24;
  bool bVar31;
  undefined *puVar32;
  long lVar33;
  int iVar34;
  code *pcVar35;
  Convolution *this_00;
  int iVar36;
  int iVar37;
  int local_1f4;
  int local_1f0;
  Mat bottom_blob_int8;
  Option opt_g;
  Mat bottom_blob_unbordered;
  Mat top_blob_tm_g;
  vector<float,_std::allocator<float>_> local_c8 [2];
  Mat top_blob_g;
  Option opt_g_1;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined3 uVar13;
  undefined1 uVar14;
  undefined2 uVar15;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined3 uVar20;
  undefined1 uVar21;
  undefined2 uVar22;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined3 uVar27;
  undefined1 uVar28;
  undefined2 uVar29;
  undefined1 uVar30;
  
  bottom_blob_unbordered.dims = bottom_blob->dims;
  this_00 = (Convolution *)
            ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
  if (bottom_blob_unbordered.dims != 3) {
LAB_00130f80:
    iVar37 = Convolution::forward(this_00,bottom_blob,top_blob,opt);
    return iVar37;
  }
  iVar37 = this_00->kernel_w;
  if (iVar37 != this_00->kernel_h) goto LAB_00130f80;
  iVar2 = this_00->stride_w;
  if (((iVar2 != this_00->stride_h) || (7 < iVar2 || 7 < iVar37)) ||
     (this_00->dilation_w != this_00->dilation_h)) goto LAB_00130f80;
  if (this_00->use_int8_inference == true) {
    lVar33 = (long)iVar37 + -1;
    lVar1 = (long)iVar2 + -1;
    if (this_00->use_int8_requantize == true) {
      puVar32 = (&PTR_conv1x1s1_int8_requant_sse_00196e50)[lVar33 * 4 + lVar1];
      pcVar35 = (code *)0x0;
    }
    else {
      pcVar35 = (code *)(&PTR_conv1x1s1_int8_dequant_sse_00196d70)[lVar33 * 4 + lVar1];
      puVar32 = (undefined *)0x0;
    }
    if (puVar32 == (undefined *)0x0 && pcVar35 == (code *)0x0) goto LAB_00130f80;
  }
  else {
    lVar33 = *(long *)((long)iVar37 * 0x20 + 0x196c68 + (long)iVar2 * 8);
    if (lVar33 == 0) goto LAB_00130f80;
    if (this_00->dilation_w != 1) {
      if (iVar2 == 1) {
        iVar37 = (*this->_vptr_Convolution_x86[3])(this,bottom_blob,top_blob,lVar33,opt);
        return iVar37;
      }
      goto LAB_00130f80;
    }
    pcVar35 = (code *)0x0;
  }
  local_1f4 = bottom_blob->w;
  local_1f0 = bottom_blob->h;
  bottom_blob_unbordered.c = bottom_blob->c;
  sVar5 = bottom_blob->elemsize;
  bottom_blob_unbordered.data = bottom_blob->data;
  bottom_blob_unbordered.refcount = bottom_blob->refcount;
  bottom_blob_unbordered.elempack = bottom_blob->elempack;
  bottom_blob_unbordered.allocator = bottom_blob->allocator;
  bottom_blob_unbordered.cstep = bottom_blob->cstep;
  if (bottom_blob_unbordered.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_unbordered.refcount = *bottom_blob_unbordered.refcount + 1;
    UNLOCK();
  }
  bottom_blob_unbordered.elemsize = sVar5;
  bottom_blob_unbordered.w = local_1f4;
  bottom_blob_unbordered.h = local_1f0;
  if ((sVar5 != 1 & (&this->field_0x1c8)[(long)this->_vptr_Convolution_x86[-3]]) == 1) {
    bottom_blob_int8.elemsize._0_4_ = 0;
    bottom_blob_int8.elemsize._4_4_ = 0;
    bottom_blob_int8.elempack = 0;
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount._0_4_ = 0;
    bottom_blob_int8.refcount._4_4_ = 0;
    bottom_blob_int8.allocator = (Allocator *)0x0;
    bottom_blob_int8.dims = 0;
    bottom_blob_int8.w = 0;
    bottom_blob_int8.h = 0;
    bottom_blob_int8.c = 0;
    bottom_blob_int8.cstep = 0;
    Mat::create(&bottom_blob_int8,local_1f4,local_1f0,bottom_blob_unbordered.c,1,
                opt->workspace_allocator);
    bVar31 = bottom_blob_int8.data == (void *)0x0 ||
             (long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0;
    if (bVar31) {
      Mat::~Mat(&bottom_blob_int8);
      iVar34 = -100;
      goto LAB_001319b7;
    }
    opt_g.lightmode = opt->lightmode;
    opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_g.num_threads = opt->num_threads;
    opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
    opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
    opt_g.use_winograd_convolution = opt->use_winograd_convolution;
    opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_g.use_int8_inference = opt->use_int8_inference;
    opt_g.use_vulkan_compute = opt->use_vulkan_compute;
    opt_g.use_fp16_packed = opt->use_fp16_packed;
    opt_g.use_fp16_storage = opt->use_fp16_storage;
    opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_g.use_int8_storage = opt->use_int8_storage;
    opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_g.use_packing_layout = opt->use_packing_layout;
    opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
    opt_g.blob_allocator._0_4_ = SUB84(bottom_blob_int8.allocator,0);
    opt_g.blob_allocator._4_4_ = (undefined4)((ulong)bottom_blob_int8.allocator >> 0x20);
    (**(code **)(**(long **)(&this->field_0x1d0 + (long)this->_vptr_Convolution_x86[-3]) + 0x38))
              (*(long **)(&this->field_0x1d0 + (long)this->_vptr_Convolution_x86[-3]),bottom_blob);
    Mat::operator=(&bottom_blob_unbordered,&bottom_blob_int8);
    Mat::~Mat(&bottom_blob_int8);
    iVar34 = -100;
    if (bVar31) goto LAB_001319b7;
  }
  bottom_blob_int8.data = bottom_blob_unbordered.data;
  bottom_blob_int8.refcount._0_4_ = SUB84(bottom_blob_unbordered.refcount,0);
  bottom_blob_int8.refcount._4_4_ = (undefined4)((ulong)bottom_blob_unbordered.refcount >> 0x20);
  bottom_blob_int8.elemsize._0_4_ = (undefined4)bottom_blob_unbordered.elemsize;
  bottom_blob_int8.elemsize._4_4_ = (undefined4)(bottom_blob_unbordered.elemsize >> 0x20);
  bottom_blob_int8.elempack = bottom_blob_unbordered.elempack;
  bottom_blob_int8.allocator = bottom_blob_unbordered.allocator;
  bottom_blob_int8.dims = bottom_blob_unbordered.dims;
  bottom_blob_int8.w = bottom_blob_unbordered.w;
  bottom_blob_int8.h = bottom_blob_unbordered.h;
  bottom_blob_int8.c = bottom_blob_unbordered.c;
  bottom_blob_int8.cstep = bottom_blob_unbordered.cstep;
  if (bottom_blob_unbordered.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_unbordered.refcount = *bottom_blob_unbordered.refcount + 1;
    UNLOCK();
  }
  pp_Var6 = this->_vptr_Convolution_x86;
  p_Var7 = pp_Var6[-3];
  iVar34 = *(int *)(p_Var7 + 4 +
                   (long)&(this->weight_3x3_winograd43_data).
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>);
  if (((iVar34 < 1) &&
      (iVar36 = *(int *)(p_Var7 + 8 +
                        (long)&(this->weight_3x3_winograd43_data).
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
      iVar36 < 1)) &&
     ((iVar3 = *(int *)(p_Var7 + 0xc +
                       (long)&(this->weight_3x3_winograd43_data).
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>), iVar3 < 1
      && (iVar4 = *(int *)(p_Var7 + 0x10 +
                          (long)&(this->weight_3x3_winograd43_data).
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
         iVar4 < 1)))) {
    if (((iVar34 == -0xe9) && (iVar36 == -0xe9)) && ((iVar3 == -0xe9 && (iVar4 == -0xe9)))) {
      iVar36 = ~((local_1f4 + -1) % iVar2) + iVar37;
      iVar34 = ~((local_1f0 + -1) % iVar2) + iVar37;
      if ((iVar36 < 1) && (iVar34 < 1)) {
LAB_00131813:
        bVar31 = true;
        local_1f4 = bottom_blob_int8.w;
        local_1f0 = bottom_blob_int8.h;
      }
      else {
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        uVar17._0_1_ = opt->use_winograd_convolution;
        uVar17._1_1_ = opt->use_sgemm_convolution;
        uVar17._2_1_ = opt->use_int8_inference;
        uVar17._3_1_ = opt->use_vulkan_compute;
        uVar18 = opt->use_fp16_packed;
        uVar19 = opt->use_fp16_storage;
        uVar21 = opt->use_fp16_arithmetic;
        uVar23 = opt->use_int8_storage;
        uVar22 = CONCAT11(uVar23,uVar21);
        uVar20 = CONCAT21(uVar22,uVar19);
        uVar17._4_4_ = CONCAT31(uVar20,uVar18);
        opt_g.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
        opt_g.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        opt_g._24_4_ = SUB84(uVar17,0);
        opt_g.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
        opt_g.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        opt_g._28_4_ = uVar17._4_4_;
        copy_make_border(&bottom_blob_unbordered,&bottom_blob_int8,iVar34 / 2,iVar34 - iVar34 / 2,
                         iVar36 / 2,iVar36 - iVar36 / 2,0,
                         *(float *)(pp_Var6[-3] + 0x14 +
                                   (long)&(this->weight_3x3_winograd43_data).
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                         ,&opt_g);
        if ((bottom_blob_int8.data != (void *)0x0) &&
           ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0)) goto LAB_00131813;
        bVar31 = false;
      }
      iVar34 = -100;
      if (bVar31) goto LAB_0013117c;
    }
    else {
      if ((((iVar34 != -0xea) || (iVar36 != -0xea)) || (iVar3 != -0xea)) || (iVar4 != -0xea))
      goto LAB_0013117c;
      iVar36 = ~((local_1f4 + -1) % iVar2) + iVar37;
      iVar34 = ~((local_1f0 + -1) % iVar2) + iVar37;
      if ((iVar36 < 1) && (iVar34 < 1)) {
LAB_00131909:
        local_1f4 = bottom_blob_int8.w;
        local_1f0 = bottom_blob_int8.h;
        bVar31 = true;
      }
      else {
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        uVar24._0_1_ = opt->use_winograd_convolution;
        uVar24._1_1_ = opt->use_sgemm_convolution;
        uVar24._2_1_ = opt->use_int8_inference;
        uVar24._3_1_ = opt->use_vulkan_compute;
        uVar25 = opt->use_fp16_packed;
        uVar26 = opt->use_fp16_storage;
        uVar28 = opt->use_fp16_arithmetic;
        uVar30 = opt->use_int8_storage;
        uVar29 = CONCAT11(uVar30,uVar28);
        uVar27 = CONCAT21(uVar29,uVar26);
        uVar24._4_4_ = CONCAT31(uVar27,uVar25);
        opt_g.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
        opt_g.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        opt_g._24_4_ = SUB84(uVar24,0);
        opt_g.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
        opt_g.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        opt_g._28_4_ = uVar24._4_4_;
        copy_make_border(&bottom_blob_unbordered,&bottom_blob_int8,iVar34 - iVar34 / 2,iVar34 / 2,
                         iVar36 - iVar36 / 2,iVar36 / 2,0,
                         *(float *)(pp_Var6[-3] + 0x14 +
                                   (long)&(this->weight_3x3_winograd43_data).
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                         ,&opt_g);
        if ((bottom_blob_int8.data != (void *)0x0) &&
           ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0)) goto LAB_00131909;
        bVar31 = false;
      }
      iVar34 = -100;
      if (bVar31) goto LAB_0013117c;
    }
  }
  else {
    opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_g.use_packing_layout = opt->use_packing_layout;
    opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
    opt_g.lightmode = opt->lightmode;
    opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_g.num_threads = opt->num_threads;
    uVar10._0_1_ = opt->use_winograd_convolution;
    uVar10._1_1_ = opt->use_sgemm_convolution;
    uVar10._2_1_ = opt->use_int8_inference;
    uVar10._3_1_ = opt->use_vulkan_compute;
    uVar11 = opt->use_fp16_packed;
    uVar12 = opt->use_fp16_storage;
    uVar14 = opt->use_fp16_arithmetic;
    uVar16 = opt->use_int8_storage;
    uVar15 = CONCAT11(uVar16,uVar14);
    uVar13 = CONCAT21(uVar15,uVar12);
    uVar10._4_4_ = CONCAT31(uVar13,uVar11);
    opt_g.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_g.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_g._24_4_ = SUB84(uVar10,0);
    opt_g.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_g.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    p_Var7 = pp_Var6[-3];
    opt_g._28_4_ = uVar10._4_4_;
    copy_make_border(&bottom_blob_unbordered,&bottom_blob_int8,
                     *(int *)(p_Var7 + 0xc +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     *(int *)(p_Var7 + 0x10 +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     *(int *)(p_Var7 + 4 +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     *(int *)(p_Var7 + 8 +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),0,
                     *(float *)(p_Var7 + 0x14 +
                               (long)&(this->weight_3x3_winograd43_data).
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     &opt_g);
    bVar31 = (long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0;
    if (bottom_blob_int8.data != (void *)0x0 && bVar31) {
      local_1f4 = bottom_blob_int8.w;
      local_1f0 = bottom_blob_int8.h;
    }
    iVar34 = -100;
    if (bottom_blob_int8.data == (void *)0x0 || !bVar31) goto LAB_001319ad;
LAB_0013117c:
    iVar36 = (local_1f4 - iVar37) / iVar2;
    iVar34 = iVar36 + 1;
    iVar2 = (local_1f0 - iVar37) / iVar2;
    iVar37 = iVar2 + 1;
    p_Var7 = this->_vptr_Convolution_x86[-3];
    if ((&this->field_0x1c8)[(long)p_Var7] == '\x01') {
      if ((&this->field_0x1c9)[(long)p_Var7] == '\x01') {
        opt_g.workspace_allocator._0_4_ = 0;
        opt_g.workspace_allocator._4_4_ = 0;
        opt_g.use_winograd_convolution = false;
        opt_g.use_sgemm_convolution = false;
        opt_g.use_int8_inference = false;
        opt_g.use_vulkan_compute = false;
        opt_g.lightmode = false;
        opt_g._1_3_ = 0;
        opt_g.num_threads = 0;
        opt_g.blob_allocator._0_4_ = 0;
        opt_g.blob_allocator._4_4_ = 0;
        opt_g.use_int8_arithmetic = false;
        opt_g.use_packing_layout = false;
        opt_g._34_6_ = 0;
        Mat::create((Mat *)&opt_g,iVar34,iVar37,
                    *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                            (long)&(this->weight_sgemm_data).data),4,opt->workspace_allocator);
        Mat::~Mat((Mat *)&opt_g);
        iVar34 = -100;
      }
      else {
        Mat::create(top_blob,iVar34,iVar37,
                    *(int *)(p_Var7 + 0x28 + (long)&(this->weight_sgemm_data).data),4,
                    opt->blob_allocator);
        iVar34 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if (this->use_winograd3x3 == true) {
            conv3x3s1_winograd43_int8_sse
                      (&bottom_blob_int8,top_blob,&this->weight_3x3_winograd23_data,opt);
            pp_Var6 = this->_vptr_Convolution_x86;
            if (0 < *(int *)(pp_Var6[-3] + 0x28 + (long)&(this->weight_sgemm_data).data)) {
              lVar33 = 0;
              do {
                top_blob_tm_g.elemsize = (size_t)opt->workspace_allocator;
                top_blob_tm_g.elempack._0_1_ = opt->use_winograd_convolution;
                top_blob_tm_g.elempack._1_1_ = opt->use_sgemm_convolution;
                top_blob_tm_g.elempack._2_1_ = opt->use_int8_inference;
                top_blob_tm_g.elempack._3_1_ = opt->use_vulkan_compute;
                top_blob_tm_g._28_1_ = opt->use_fp16_packed;
                top_blob_tm_g._29_1_ = opt->use_fp16_storage;
                top_blob_tm_g._30_1_ = opt->use_fp16_arithmetic;
                top_blob_tm_g._31_1_ = opt->use_int8_storage;
                top_blob_tm_g.allocator = *(Allocator **)&opt->use_int8_arithmetic;
                top_blob_tm_g.data = (void *)CONCAT44(1,*(undefined4 *)opt);
                opt_g._32_8_ = top_blob->allocator;
                sVar5 = top_blob->elemsize;
                opt_g._0_8_ = top_blob->cstep * lVar33 * sVar5 + (long)top_blob->data;
                opt_g._24_4_ = top_blob->elempack;
                opt_g.blob_allocator._0_4_ = 0;
                opt_g.blob_allocator._4_4_ = 0;
                opt_g.workspace_allocator._0_4_ = (undefined4)sVar5;
                opt_g.workspace_allocator._4_4_ = (undefined4)(sVar5 >> 0x20);
                plVar8 = *(long **)(*(long *)(&this->field_0x1d8 + (long)pp_Var6[-3]) + lVar33 * 8);
                top_blob_tm_g.refcount = (int *)opt_g._32_8_;
                (**(code **)(*plVar8 + 0x48))(plVar8,(Mat *)&opt_g,&top_blob_tm_g);
                Mat::~Mat((Mat *)&opt_g);
                lVar33 = lVar33 + 1;
                pp_Var6 = this->_vptr_Convolution_x86;
              } while (lVar33 < *(int *)(pp_Var6[-3] + 0x28 + (long)&(this->weight_sgemm_data).data)
                      );
            }
          }
          else {
            p_Var7 = this->_vptr_Convolution_x86[-3];
            std::vector<float,_std::allocator<float>_>::vector
                      (local_c8,(vector<float,_std::allocator<float>_> *)
                                (&this->field_0x208 + (long)p_Var7));
            (*pcVar35)(&bottom_blob_int8,top_blob,&this->field_0x100 + (long)p_Var7,
                       &this->field_0x140 + (long)p_Var7,local_c8,opt);
            if (local_c8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_c8[0].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c8[0].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          goto LAB_00131995;
        }
      }
    }
    else {
      Mat::create(top_blob,iVar34,iVar37,
                  *(int *)(p_Var7 + 0x28 + (long)&(this->weight_sgemm_data).data),sVar5,
                  opt->blob_allocator);
      iVar34 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        p_Var7 = this->_vptr_Convolution_x86[-3];
        if ((this->use_winograd3x3 == true) && ((6 < iVar36 && (6 < iVar2)))) {
          conv3x3s1_winograd23_sse
                    (&bottom_blob_int8,top_blob,&this->weight_3x3_winograd23_data,
                     (Mat *)(&this->field_0x140 + (long)p_Var7),opt);
        }
        else {
          conv_im2col_sgemm_sse
                    (&bottom_blob_int8,top_blob,&this->weight_sgemm_data,
                     (Mat *)(&this->field_0x140 + (long)p_Var7),
                     *(int *)(p_Var7 + 0x2c + (long)&(this->weight_sgemm_data).data),
                     *(int *)(p_Var7 + 0x30 + (long)&(this->weight_sgemm_data).data),
                     *(int *)(p_Var7 + 0x3c + (long)&(this->weight_sgemm_data).data),
                     *(int *)(p_Var7 + (long)&(this->weight_3x3_winograd43_data).
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                             ),opt);
        }
LAB_00131995:
        pLVar9 = this->activation;
        if (pLVar9 != (Layer *)0x0) {
          (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
        }
        iVar34 = 0;
      }
    }
  }
LAB_001319ad:
  Mat::~Mat(&bottom_blob_int8);
LAB_001319b7:
  Mat::~Mat(&bottom_blob_unbordered);
  return iVar34;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    const int kernel_size = kernel_w;
    const int stride = stride_w;  

    if (kernel_size > 7 || stride > 7 || dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    typedef void (*conv_func)(const Mat&, Mat&, const Mat&, const Mat&, const Option&);

    // kernel_size x stride
    conv_func conv_func_table[7][4] =
    {
        {
            conv1x1s1_sse,
            conv1x1s2_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_sse,
            conv3x3s2_sse,
            0,
            0
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {
            conv5x5s1_sse,
            conv5x5s2_sse,
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_sse,          
            conv7x7s2_sse,          
            0,
            0
        }  // kernel_size = 7        
    };

    typedef void (*conv_int8_dequant_func)(const Mat&, Mat&, const Mat&, const Mat&, std::vector<float>, const Option&);
    typedef void (*conv_int8_requant_func)(const Mat&, Mat&, const Mat&, const Mat&, std::vector<float>, const Option&);

    // kernel_size x stride
    conv_int8_dequant_func conv_int8_dequant_func_table[7][4] =
    {
        {
            conv1x1s1_int8_dequant_sse,
            conv1x1s2_int8_dequant_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_dequant_sse,
            conv3x3s2_int8_dequant_sse,
            0,
            0,
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {        
            conv5x5s1_int8_dequant_sse,
            conv5x5s2_int8_dequant_sse,    
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_int8_dequant_sse,          
            conv7x7s2_int8_dequant_sse, 
            0,
            0
        }  // kernel_size = 7
    };

    conv_int8_requant_func conv_int8_requant_func_table[7][4] =
    {
        {
            conv1x1s1_int8_requant_sse,
            conv1x1s2_int8_requant_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_requant_sse,
            conv3x3s2_int8_requant_sse,
            0,
            0,
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {        
            conv5x5s1_int8_requant_sse,
            conv5x5s2_int8_requant_sse,    
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_int8_requant_sse,          
            conv7x7s2_int8_requant_sse, 
            0,
            0
        }  // kernel_size = 7
    };

    conv_func conv = 0;
    conv_int8_dequant_func conv_int8_dequant = 0;
    conv_int8_requant_func conv_int8_requant = 0;

    if (use_int8_inference)
    {
        if (use_int8_requantize)
            conv_int8_requant = conv_int8_requant_func_table[kernel_size-1][stride-1];
        else
            conv_int8_dequant = conv_int8_dequant_func_table[kernel_size-1][stride-1];  
        if ((!conv_int8_requant) && (!conv_int8_dequant))
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }
    }
    else
    {
        conv = conv_func_table[kernel_size-1][stride-1];
        if (!conv)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }

        if (dilation_w != 1)
        {
            if (stride != 1)
                return Convolution::forward(bottom_blob, top_blob, opt);

            return forwardDilation(bottom_blob, top_blob, conv, opt);
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_size) / stride + 1;
    int outh = (h - kernel_size) / stride + 1;

    // int8
    if (use_int8_inference)
    {         
        if (use_int8_requantize == true)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100; 

            if (use_winograd3x3)
            {
                // conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data, opt);
                conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data, opt);

                // requantize, reverse scale inplace
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p=0; p<num_output; p++)
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    requantize_ops[p]->forward(top_blob_tm_g, top_blob_g, opt_g);
                }
            }
            else
                conv_int8_requant(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            if (use_winograd3x3)
            {
                // conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, opt);
                conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, opt);

                // dequantize, reverse scale inplace
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p=0; p<num_output; p++)
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    dequantize_ops[p]->forward_inplace(top_blob_g, opt_g);
                }
            }
            else
                conv_int8_dequant(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);     
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }        

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;    

    if (use_winograd3x3 && outw >= 8 && outh >=8)
    {
        conv3x3s1_winograd23_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
//         conv3x3s1_winograd43_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd43_data, bias_data, opt);
    }
    else
        //conv(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
        conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}